

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void insertion_sort<10u>(Cacheblock<10U> *cache,int n,size_t depth)

{
  uchar *puVar1;
  bool bVar2;
  byte *local_48;
  uchar *t;
  uchar *s;
  uchar *tmp;
  Cacheblock<10U> *pj;
  Cacheblock<10U> *pi;
  size_t depth_local;
  int n_local;
  Cacheblock<10U> *cache_local;
  
  pj = cache + 1;
  depth_local._4_4_ = n;
  do {
    depth_local._4_4_ = depth_local._4_4_ + -1;
    if (depth_local._4_4_ < 1) {
      return;
    }
    puVar1 = pj->ptr;
    for (tmp = (uchar *)pj; cache < tmp; tmp = tmp + -0x18) {
      t = (uchar *)(*(long *)(tmp + -8) + depth);
      local_48 = puVar1 + depth;
      while( true ) {
        bVar2 = false;
        if (*t == *local_48) {
          bVar2 = *t != '\0';
        }
        if (!bVar2) break;
        t = t + 1;
        local_48 = local_48 + 1;
      }
      if (*t <= *local_48) break;
      *(undefined8 *)(tmp + 0x10) = *(undefined8 *)(tmp + -8);
    }
    *(uchar **)(tmp + 0x10) = puVar1;
    pj = pj + 1;
  } while( true );
}

Assistant:

static void
insertion_sort(Cacheblock<CachedChars>* cache, int n, size_t depth)
{
	Cacheblock<CachedChars>* pi;
	Cacheblock<CachedChars>* pj;
	for (pi = cache + 1; --n > 0; ++pi) {
		unsigned char* tmp = pi->ptr;
		for (pj = pi; pj > cache; --pj) {
			unsigned char* s = (pj-1)->ptr+depth;
			unsigned char* t = tmp+depth;
			for (; *s==*t && *s!=0; ++s, ++t)
				;
			if (*s <= *t)
				break;
			pj->ptr = (pj-1)->ptr;
		}
		pj->ptr = tmp;
	}
}